

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

void __thiscall
ON_BumpFunction::Internal_EvaluateLinearBump
          (ON_BumpFunction *this,double t,double dt,int der_count,double *value)

{
  double *local_30;
  double *value_local;
  int der_count_local;
  double dt_local;
  double t_local;
  ON_BumpFunction *this_local;
  
  *value = t;
  if ((0 < der_count) && (value[1] = dt, 1 < der_count)) {
    local_30 = value + 2;
    value_local._4_4_ = der_count + -1;
    while (value_local._4_4_ != 0) {
      *local_30 = 0.0;
      local_30 = local_30 + 1;
      value_local._4_4_ = value_local._4_4_ + -1;
    }
  }
  return;
}

Assistant:

void ON_BumpFunction::Internal_EvaluateLinearBump(double t, double dt, int der_count, double* value) const
{
  value[0] = t;
  if (der_count>0)
  {
    value[1] = dt;
    if ( der_count > 1 )
    {
      der_count--;
      value += 2;
      while(der_count--)
        *value++ = 0.0;
    }
  }
}